

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterDcStatAccess.cpp
# Opt level: O2

long __thiscall bhf::ads::MasterDcStatAccess::Print(MasterDcStatAccess *this,ostream *os)

{
  long lVar1;
  ostream *poVar2;
  AdsException *this_00;
  long lVar3;
  string *this_01;
  allocator local_245;
  allocator local_244;
  allocator local_243;
  allocator local_242;
  allocator local_241;
  allocator local_240;
  allocator local_23f;
  allocator local_23e;
  allocator local_23d;
  uint32_t bytesRead;
  string local_238;
  array<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  rowNames;
  anon_struct_96_6_2ef3beec stat;
  
  lVar1 = AdsDevice::ReadReqEx2(&this->device,0x2f,0,0x60,&stat,&bytesRead);
  if (lVar1 == 0) {
    if (bytesRead != 0x60) {
      std::__cxx11::stringstream::stringstream((stringstream *)&rowNames);
      poVar2 = std::operator<<((ostream *)rowNames._M_elems[0].field_2._M_local_buf,"Print");
      std::operator<<(poVar2,"Corrupt ECAT_DC_TIMING_STAT length.\n");
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::stringstream::~stringstream((stringstream *)&rowNames);
      this_00 = (AdsException *)__cxa_allocate_exception(0x30);
      AdsException::AdsException(this_00,0x706);
      __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
    }
    this_01 = (string *)&rowNames;
    std::__cxx11::string::string(this_01,"1",(allocator *)&local_238);
    std::__cxx11::string::string((string *)(rowNames._M_elems + 1),"2",&local_23d);
    std::__cxx11::string::string((string *)(rowNames._M_elems + 2),"5",&local_23e);
    std::__cxx11::string::string((string *)(rowNames._M_elems + 3),"10",&local_23f);
    std::__cxx11::string::string((string *)(rowNames._M_elems + 4),"20",&local_240);
    std::__cxx11::string::string((string *)(rowNames._M_elems + 5),"50",&local_241);
    std::__cxx11::string::string((string *)(rowNames._M_elems + 6),"100",&local_242);
    std::__cxx11::string::string((string *)(rowNames._M_elems + 7),"200",&local_243);
    std::__cxx11::string::string((string *)(rowNames._M_elems + 8),"500",&local_244);
    std::__cxx11::string::string((string *)(rowNames._M_elems + 9),anon_var_dwarf_35993,&local_245);
    poVar2 = std::operator<<(os,"Deviation <");
    poVar2 = std::operator<<(poVar2," | ");
    poVar2 = std::operator<<(poVar2,"Count (neg)");
    poVar2 = std::operator<<(poVar2," | ");
    poVar2 = std::operator<<(poVar2,"Count (pos)");
    std::operator<<(poVar2,'\n');
    for (lVar3 = -0x28; lVar3 != 0; lVar3 = lVar3 + 4) {
      poVar2 = std::operator<<(os,this_01);
      poVar2 = std::operator<<(poVar2," | ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," | ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,'\n');
      this_01 = this_01 + 0x20;
    }
    poVar2 = std::operator<<(os,"Sum");
    poVar2 = std::operator<<(poVar2," | ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," | ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,'\n');
    std::
    array<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
    ::~array(&rowNames);
  }
  else {
    if (lVar1 == 0x712) {
      std::__cxx11::stringstream::stringstream((stringstream *)&rowNames);
      poVar2 = std::operator<<((ostream *)rowNames._M_elems[0].field_2._M_local_buf,
                               "Reading DC diagnosis failed with 0x");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      std::operator<<(poVar2,". Try activating it first (\'adstool dc-diag activate\').");
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_238);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&rowNames);
      poVar2 = std::operator<<((ostream *)rowNames._M_elems[0].field_2._M_local_buf,
                               "Reading DC diagnosis failed with 0x");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<long>((long)poVar2);
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_238);
    }
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::stringstream::~stringstream((stringstream *)&rowNames);
  }
  return lVar1;
}

Assistant:

long MasterDcStatAccess::Print(std::ostream& os) const
{
    uint32_t bytesRead;

    struct {
        uint32_t count;
        uint32_t pos;
        uint32_t neg;
        uint32_t maxDiff;
        uint32_t posArr[10];
        uint32_t negArr[10];
    } stat;

    const auto status = device.ReadReqEx2(
        ECADS_IGRP_MASTER_DC_STAT,
        0,
        sizeof(stat),
        &stat,
        &bytesRead
        );

    if (status == ADSERR_DEVICE_INVALIDSTATE) {
        LOG_ERROR(
            "Reading DC diagnosis failed with 0x" << std::hex << status <<
                ". Try activating it first ('adstool dc-diag activate').");
        return status;
    } else if (status != ADSERR_NOERR) {
        LOG_ERROR("Reading DC diagnosis failed with 0x" << std::hex << status);
        return status;
    } else if (bytesRead != sizeof(stat)) {
        LOG_ERROR(__FUNCTION__ << "Corrupt ECAT_DC_TIMING_STAT length.\n");
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }

    const std::array<const std::string, sizeof(stat.posArr) / sizeof(stat.posArr[0])> rowNames{{
        "1",
        "2",
        "5",
        "10",
        "20",
        "50",
        "100",
        "200",
        "500",
        "\u221E" // infinity symbol
    }};

    os << "Deviation <" << " | " << "Count (neg)" << " | " << "Count (pos)" << '\n';
    for (size_t i = 0; i < rowNames.size(); i++) {
        os << rowNames[i] << " | " << stat.negArr[i] << " | " << stat.posArr[i] << '\n';
    }
    os << "Sum" << " | " << stat.neg << " | " << stat.pos << '\n';

    return status;
}